

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O0

void __thiscall xLearn::InmemReader::Initialize(InmemReader *this,string *filename)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  undefined8 uVar4;
  void *pvVar5;
  string *in_RSI;
  long in_RDI;
  undefined8 in_stack_fffffffffffffe78;
  bool important;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  string *in_stack_fffffffffffffef0;
  InmemReader *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  int line;
  allocator *paVar7;
  LogSeverity severity;
  string local_e0 [16];
  InmemReader *in_stack_ffffffffffffff30;
  string local_c0 [39];
  allocator local_99;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [36];
  Logger local_14;
  string *local_10;
  
  line = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  local_10 = in_RSI;
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) == 1) {
    Logger::Logger(&local_14,ERR);
    paVar7 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/reader.cc"
               ,paVar7);
    severity = (LogSeverity)((ulong)paVar7 >> 0x20);
    paVar7 = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Initialize",paVar7);
    poVar3 = Logger::Start(severity,(string *)paVar7,line,(string *)in_stack_fffffffffffffef8);
    poVar3 = std::operator<<(poVar3,"CHECK_NE failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/reader.cc"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x7f);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"filename.empty()");
    poVar3 = std::operator<<(poVar3," = ");
    bVar2 = (bool)std::__cxx11::string::empty();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"true");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,true);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    Logger::~Logger((Logger *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    abort();
  }
  std::__cxx11::string::operator=((string *)(in_RDI + 8),local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff68,
             "First check if the text file has been already converted to binary format.",&local_99);
  important = SUB81((ulong)in_stack_fffffffffffffe78 >> 0x38,0);
  Color::print_info((string *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                    important);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  bVar2 = hash_binary(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  if (bVar2) {
    uVar4 = std::__cxx11::string::c_str();
    uVar6 = 0;
    StringPrintf_abi_cxx11_
              ((char *)local_c0,"Binary file (%s.bin) found. Skip converting text to binary.",uVar4)
    ;
    Color::print_info((string *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                      important);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::operator+=((string *)(in_RDI + 8),".bin");
    init_from_binary((InmemReader *)CONCAT44(uVar6,in_stack_fffffffffffffe90));
  }
  else {
    uVar4 = std::__cxx11::string::c_str();
    uVar6 = 0;
    StringPrintf_abi_cxx11_
              ((char *)local_e0,"Binary file (%s.bin) NOT found. Convert text file to binary file.",
               uVar4);
    Color::print_info((string *)CONCAT44(uVar6,in_stack_fffffffffffffe80),
                      SUB81((ulong)local_e0 >> 0x38,0));
    std::__cxx11::string::~string(local_e0);
    pvVar5 = malloc(*(long *)(in_RDI + 200) << 0x14);
    *(void **)(in_RDI + 0xc0) = pvVar5;
    init_from_txt(in_stack_ffffffffffffff30);
  }
  return;
}

Assistant:

void InmemReader::Initialize(const std::string& filename) {
  CHECK_NE(filename.empty(), true)
  filename_ = filename;
  Color::print_info("First check if the text file has been already "
                    "converted to binary format.");
  // HashBinary() will read the first two hash value
  // and then check it whether equal to the hash value generated
  // by HashFile() function from current txt file.
  if (hash_binary(filename_)) {
    Color::print_info(
      StringPrintf("Binary file (%s.bin) found. "
                   "Skip converting text to binary.",
                   filename_.c_str())
    );
    filename_ += ".bin";
    init_from_binary();
  } else {
    Color::print_info(
      StringPrintf("Binary file (%s.bin) NOT found. Convert text "
                   "file to binary file.",
                   filename_.c_str())
    );
    // Allocate memory for block
    try {
      this->block_ = (char*)malloc(block_size_*1024*1024);
    } catch (std::bad_alloc&) {
      LOG(FATAL) << "Cannot allocate enough memory for data  \
                     block. Block size: " 
                 << block_size_ << "MB. "
                 << "You set change the block size via configuration.";
    }
    init_from_txt();
  }
}